

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase109::run(TestCase109 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  uchar *__dest;
  uchar *__src;
  ArrayPtr<unsigned_char> AVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  ArrayPtr<const_char> AVar6;
  ArrayPtr<char> AVar7;
  ArrayPtr<const_char> value;
  ArrayPtr<const_char> value_00;
  ArrayPtr<const_char> value_01;
  undefined8 in_stack_ffffffffffffe3e0;
  undefined8 in_stack_ffffffffffffe3e8;
  Builder local_1860;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_1848;
  Builder local_1820;
  bool local_1801;
  undefined1 local_1800 [7];
  bool _kj_shouldLog_23;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_17e8;
  Builder local_17c0;
  char (*local_17a8) [6];
  undefined1 local_17a0 [8];
  DebugComparison<const_char_(&)[6],_capnp::Text::Builder> _kjCondition_23;
  ArrayPtr<unsigned_char> local_1750;
  ArrayPtr<char> local_1740;
  ArrayPtr<const_char> local_1730;
  String local_1720;
  bool local_1701;
  undefined1 local_1700 [7];
  bool _kj_shouldLog_22;
  ArrayPtr<unsigned_char> local_16e8;
  ArrayPtr<char> local_16d8;
  ArrayPtr<const_char> local_16c8;
  String local_16b8;
  char (*local_16a0) [4];
  undefined1 local_1698 [8];
  DebugComparison<const_char_(&)[4],_kj::String> _kjCondition_22;
  BuilderFor<capnp::Text> local_1648;
  bool local_1629;
  undefined1 local_1628 [7];
  bool _kj_shouldLog_21;
  BuilderFor<capnp::Text> local_1610;
  char (*local_15f8) [4];
  undefined1 local_15f0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_21;
  Builder ptrs_1;
  ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_1570;
  ArrayPtr<const_char> local_1540;
  bool local_1529;
  undefined1 local_1528 [7];
  bool _kj_shouldLog_20;
  ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_1508;
  ArrayPtr<const_char> local_14d8;
  char (*local_14c8) [6];
  undefined1 local_14c0 [8];
  DebugComparison<const_char_(&)[6],_capnp::Text::Reader> _kjCondition_20;
  ArrayPtr<const_unsigned_char> local_1470;
  ArrayPtr<const_char> local_1460;
  String local_1450;
  bool local_1431;
  undefined1 local_1430 [7];
  bool _kj_shouldLog_19;
  ArrayPtr<const_unsigned_char> local_1410;
  ArrayPtr<const_char> local_1400;
  String local_13f0;
  char (*local_13d8) [4];
  undefined1 local_13d0 [8];
  DebugComparison<const_char_(&)[4],_kj::String> _kjCondition_19;
  ArrayPtr<const_char> local_1378;
  bool local_1361;
  undefined1 local_1360 [7];
  bool _kj_shouldLog_18;
  ArrayPtr<const_char> local_1340;
  char (*local_1330) [4];
  undefined1 local_1328 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_18;
  Reader ptrs;
  ArrayPtr<const_unsigned_char> local_12b8;
  ArrayPtr<unsigned_char> local_12a8;
  Builder local_1298;
  uint local_126c [2];
  bool local_1261;
  undefined1 local_1260 [7];
  bool _kj_shouldLog_17;
  uint local_1234 [2];
  DebugExpression<int> local_122c;
  undefined1 local_1228 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_17;
  size_t local_11f8;
  int local_11f0;
  bool local_11e9;
  undefined1 auStack_11e8 [7];
  bool _kj_shouldLog_16;
  size_t local_11e0;
  size_t local_11d8;
  int local_11d0;
  DebugExpression<int> local_11cc;
  undefined1 local_11c8 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_16;
  ArrayPtr<const_unsigned_char> local_1170;
  Builder local_1160;
  undefined1 local_1148 [8];
  Builder sb;
  Builder root2;
  MallocMessageBuilder b2;
  uint local_fd4 [2];
  bool local_fc9;
  undefined1 local_fc8 [7];
  bool _kj_shouldLog_15;
  uint local_f94 [2];
  DebugExpression<int> local_f8c;
  undefined1 local_f88 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_15;
  size_t local_f58;
  int local_f50;
  bool local_f49;
  undefined1 auStack_f48 [7];
  bool _kj_shouldLog_14;
  size_t local_f40;
  size_t local_f38;
  int local_f30;
  DebugExpression<int> local_f2c;
  undefined1 local_f28 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_14;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_ee8;
  Reader local_ec0;
  Reader local_e90;
  Reader local_e60;
  uint local_e2c [2];
  bool local_e21;
  undefined1 local_e20 [7];
  bool _kj_shouldLog_13;
  uint local_dec [2];
  DebugExpression<int> local_de4;
  undefined1 local_de0 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_13;
  size_t local_db0;
  int local_da8;
  bool local_da1;
  undefined1 auStack_da0 [7];
  bool _kj_shouldLog_12;
  size_t local_d98;
  size_t local_d90;
  int local_d88;
  DebugExpression<int> local_d84;
  undefined1 local_d80 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_12;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_d40;
  BuilderFor<AnyTypeFor<FromBuilder<Builder>_>_> local_d18;
  Reader local_cf0;
  Reader local_cc0;
  uint local_c8c [2];
  bool local_c81;
  undefined1 local_c80 [7];
  bool _kj_shouldLog_11;
  uint local_c4c [2];
  DebugExpression<int> local_c44;
  undefined1 local_c40 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_11;
  size_t local_c10;
  int local_c08;
  bool local_c01;
  undefined1 auStack_c00 [7];
  bool _kj_shouldLog_10;
  size_t local_bf8;
  size_t local_bf0;
  int local_be8;
  DebugExpression<int> local_be4;
  undefined1 local_be0 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_10;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_ba0;
  Reader local_b78;
  undefined1 auStack_b48 [8];
  ReaderFor<AnyTypeFor<FromReader<Reader>_>_> r;
  Builder local_b10;
  uint local_ae4 [2];
  bool local_ad9;
  undefined1 local_ad8 [7];
  bool _kj_shouldLog_9;
  uint local_aac [2];
  DebugExpression<int> local_aa4;
  undefined1 local_aa0 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_9;
  size_t local_a70;
  int local_a68;
  bool local_a61;
  undefined1 auStack_a60 [7];
  bool _kj_shouldLog_8;
  size_t local_a58;
  size_t local_a50;
  int local_a48;
  DebugExpression<int> local_a44;
  undefined1 local_a40 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_a00;
  Builder local_9d8;
  Builder local_9b0;
  uint local_984 [2];
  bool local_979;
  undefined1 local_978 [7];
  bool _kj_shouldLog_7;
  uint local_94c [2];
  DebugExpression<int> local_944;
  undefined1 local_940 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_7;
  size_t local_910;
  int local_908;
  bool local_901;
  undefined1 auStack_900 [7];
  bool _kj_shouldLog_6;
  size_t local_8f8;
  size_t local_8f0;
  int local_8e8;
  DebugExpression<int> local_8e4;
  undefined1 local_8e0 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_6;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_8a0;
  undefined1 auStack_878 [8];
  BuilderFor<AnyTypeFor<FromBuilder<Builder>_>_> b;
  Reader local_838;
  ReaderFor<capnp::AnyStruct> local_818;
  Reader local_7e8;
  uint local_7b4 [2];
  bool local_7a9;
  undefined1 local_7a8 [7];
  bool _kj_shouldLog_5;
  Reader local_790;
  ReaderFor<capnp::AnyStruct> local_770;
  Reader local_740;
  uint local_70c [2];
  DebugExpression<int> local_704;
  undefined1 local_700 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_5;
  Reader local_6c8;
  ReaderFor<capnp::AnyStruct> local_6a8;
  ArrayPtr<const_unsigned_char> local_678;
  size_t local_668;
  int local_660;
  bool local_659;
  undefined1 local_658 [7];
  bool _kj_shouldLog_4;
  Reader local_640;
  ReaderFor<capnp::AnyStruct> local_620;
  ArrayPtr<const_unsigned_char> local_5f0;
  size_t local_5e0;
  int local_5d8;
  DebugExpression<int> local_5d4;
  undefined1 local_5d0 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_4;
  BuilderFor<capnp::AnyStruct> local_590;
  Builder local_568;
  uint local_53c [2];
  bool local_531;
  undefined1 local_530 [7];
  bool _kj_shouldLog_3;
  BuilderFor<capnp::AnyStruct> local_518;
  Builder local_4f0;
  uint local_4c4 [2];
  DebugExpression<int> local_4bc;
  undefined1 local_4b8 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_3;
  BuilderFor<capnp::AnyStruct> local_480;
  ArrayPtr<unsigned_char> local_458;
  size_t local_448;
  int local_440;
  bool local_439;
  undefined1 local_438 [7];
  bool _kj_shouldLog_2;
  BuilderFor<capnp::AnyStruct> local_420;
  ArrayPtr<unsigned_char> local_3f8;
  size_t local_3e8;
  int local_3e0;
  DebugExpression<int> local_3dc;
  undefined1 local_3d8 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_2;
  bool local_3a5;
  int32_t local_3a4;
  int iStack_3a0;
  bool _kj_shouldLog_1;
  DebugExpression<int> local_39c;
  undefined1 local_398 [8];
  DebugComparison<int,_int> _kjCondition_1;
  bool local_36d;
  int32_t local_36c;
  int iStack_368;
  bool _kj_shouldLog;
  DebugExpression<int> local_364;
  undefined1 local_360 [8];
  DebugComparison<int,_int> _kjCondition;
  BuilderFor<capnp::AnyStruct> local_328;
  Reader local_300;
  undefined1 local_2d0 [8];
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> allTypesReader;
  BuilderFor<capnp::AnyStruct> local_288;
  undefined1 local_260 [8];
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> allTypes;
  Reader local_208;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1e8;
  Builder local_1b8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_1a0;
  Builder local_178;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_160;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase109 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_178,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestAllTypes>(&local_160,&local_178);
  builder_00._builder.capTable = (CapTableBuilder *)local_160._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_160._builder.capTable;
  builder_00._builder.data = local_160._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_160._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_ffffffffffffe3e0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffe3e0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffe3e0 >> 0x30);
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1b8,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1a0,&local_1b8);
  builder_01._builder.capTable = (CapTableBuilder *)local_1a0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_1a0._builder.capTable;
  builder_01._builder.data = local_1a0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_1a0._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_ffffffffffffe3e0;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffe3e0 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffe3e0 >> 0x30);
  checkTestMessage(builder_01);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)&allTypes._builder.dataSize,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_208,(Reader *)&allTypes._builder.dataSize);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1e8,&local_208);
  reader._reader.capTable = (CapTableReader *)local_1e8._reader.data;
  reader._reader.segment = (SegmentReader *)local_1e8._reader.capTable;
  reader._reader.data = local_1e8._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_1e8._reader._32_8_;
  reader._reader.dataSize = local_1e8._reader.nestingLimit;
  reader._reader.pointerCount = local_1e8._reader._44_2_;
  reader._reader._38_2_ = local_1e8._reader._46_2_;
  reader._reader._40_8_ = in_stack_ffffffffffffe3e8;
  checkTestMessage(reader);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&allTypesReader._reader.nestingLimit,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::AnyStruct>
            (&local_288,(Builder *)&allTypesReader._reader.nestingLimit);
  AnyStruct::Builder::as<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)local_260,&local_288);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::AnyStruct>(&local_328,(Builder *)&_kjCondition.result);
  AnyStruct::Builder::asReader(&local_300,&local_328);
  AnyStruct::Reader::as<capnproto_test::capnp::test::TestAllTypes>
            ((ReaderFor<capnproto_test::capnp::test::TestAllTypes> *)local_2d0,&local_300);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field((Builder *)local_260,100);
  iStack_368 = 100;
  local_364 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffc98);
  local_36c = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                        ((Builder *)local_260);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_360,&local_364,&local_36c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_360);
  if (!bVar1) {
    local_36d = kj::_::Debug::shouldLog(ERROR);
    while (local_36d != false) {
      _kjCondition_1._28_4_ = 100;
      _kjCondition_1._24_4_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field((Builder *)local_260);
      kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x78,ERROR,
                 "\"failed: expected \" \"(100) == (allTypes.getInt32Field())\", _kjCondition, 100, allTypes.getInt32Field()"
                 ,(char (*) [53])"failed: expected (100) == (allTypes.getInt32Field())",
                 (DebugComparison<int,_int> *)local_360,(int *)&_kjCondition_1.field_0x1c,
                 (int *)&_kjCondition_1.result);
      local_36d = false;
    }
  }
  iStack_3a0 = 100;
  local_39c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffc60);
  local_3a4 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field((Reader *)local_2d0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_398,&local_39c,&local_3a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_398);
  if (!bVar1) {
    local_3a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a5 != false) {
      _kjCondition_2._36_4_ = 100;
      _kjCondition_2._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field((Reader *)local_2d0);
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x79,ERROR,
                 "\"failed: expected \" \"(100) == (allTypesReader.getInt32Field())\", _kjCondition, 100, allTypesReader.getInt32Field()"
                 ,(char (*) [59])"failed: expected (100) == (allTypesReader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_398,(int *)&_kjCondition_2.field_0x24,
                 (int *)&_kjCondition_2.result);
      local_3a5 = false;
    }
  }
  local_3e0 = 0x30;
  local_3dc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3e0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_438,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::AnyStruct>(&local_420,(Builder *)local_438);
  local_3f8 = AnyStruct::Builder::getDataSection(&local_420);
  local_3e8 = kj::ArrayPtr<unsigned_char>::size(&local_3f8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_3d8,&local_3dc,&local_3e8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d8);
  if (!bVar1) {
    local_439 = kj::_::Debug::shouldLog(ERROR);
    while (local_439 != false) {
      local_440 = 0x30;
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&_kjCondition_3.result,(Builder *)local_128);
      AnyPointer::Builder::getAs<capnp::AnyStruct>(&local_480,(Builder *)&_kjCondition_3.result);
      AVar4 = AnyStruct::Builder::getDataSection(&local_480);
      local_458 = AVar4;
      local_448 = kj::ArrayPtr<unsigned_char>::size(&local_458);
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x7b,ERROR,
                 "\"failed: expected \" \"(48) == (root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size())\", _kjCondition, 48, root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size()"
                 ,(char (*) [96])
                  "failed: expected (48) == (root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size())"
                 ,(DebugComparison<int,_unsigned_long> *)local_3d8,&local_440,&local_448);
      local_439 = false;
    }
  }
  local_4c4[1] = 0x14;
  local_4bc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_4c4 + 1));
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_530,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::AnyStruct>(&local_518,(Builder *)local_530);
  AnyStruct::Builder::getPointerSection(&local_4f0,&local_518);
  local_4c4[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_4f0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_4b8,&local_4bc,local_4c4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4b8);
  if (!bVar1) {
    local_531 = kj::_::Debug::shouldLog(ERROR);
    while (local_531 != false) {
      local_53c[1] = 0x14;
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&_kjCondition_4.result,(Builder *)local_128);
      AnyPointer::Builder::getAs<capnp::AnyStruct>(&local_590,(Builder *)&_kjCondition_4.result);
      AnyStruct::Builder::getPointerSection(&local_568,&local_590);
      local_53c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_568);
      kj::_::Debug::
      log<char_const(&)[99],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x7c,ERROR,
                 "\"failed: expected \" \"(20) == (root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size())\", _kjCondition, 20, root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size()"
                 ,(char (*) [99])
                  "failed: expected (20) == (root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_4b8,(int *)(local_53c + 1),local_53c);
      local_531 = false;
    }
  }
  local_5d8 = 0x30;
  local_5d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5d8);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_658,(Builder *)local_128);
  AnyPointer::Builder::asReader(&local_640,(Builder *)local_658);
  AnyPointer::Reader::getAs<capnp::AnyStruct>(&local_620,&local_640);
  local_5f0 = AnyStruct::Reader::getDataSection(&local_620);
  local_5e0 = kj::ArrayPtr<const_unsigned_char>::size(&local_5f0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_5d0,&local_5d4,&local_5e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5d0);
  if (!bVar1) {
    local_659 = kj::_::Debug::shouldLog(ERROR);
    while (local_659 != false) {
      local_660 = 0x30;
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&_kjCondition_5.result,(Builder *)local_128);
      AnyPointer::Builder::asReader(&local_6c8,(Builder *)&_kjCondition_5.result);
      AnyPointer::Reader::getAs<capnp::AnyStruct>(&local_6a8,&local_6c8);
      AVar5 = AnyStruct::Reader::getDataSection(&local_6a8);
      local_678 = AVar5;
      local_668 = kj::ArrayPtr<const_unsigned_char>::size(&local_678);
      kj::_::Debug::
      log<char_const(&)[107],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x7e,ERROR,
                 "\"failed: expected \" \"(48) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size())\", _kjCondition, 48, root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size()"
                 ,(char (*) [107])
                  "failed: expected (48) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size())"
                 ,(DebugComparison<int,_unsigned_long> *)local_5d0,&local_660,&local_668);
      local_659 = false;
    }
  }
  local_70c[1] = 0x14;
  local_704 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_70c + 1));
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_7a8,(Builder *)local_128);
  AnyPointer::Builder::asReader(&local_790,(Builder *)local_7a8);
  AnyPointer::Reader::getAs<capnp::AnyStruct>(&local_770,&local_790);
  AnyStruct::Reader::getPointerSection(&local_740,&local_770);
  local_70c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_740);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_700,&local_704,local_70c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_700);
  if (!bVar1) {
    local_7a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7a9 != false) {
      local_7b4[1] = 0x14;
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&b._builder.structDataSize,(Builder *)local_128);
      AnyPointer::Builder::asReader(&local_838,(Builder *)&b._builder.structDataSize);
      AnyPointer::Reader::getAs<capnp::AnyStruct>(&local_818,&local_838);
      AnyStruct::Reader::getPointerSection(&local_7e8,&local_818);
      local_7b4[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_7e8);
      kj::_::Debug::
      log<char_const(&)[110],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x7f,ERROR,
                 "\"failed: expected \" \"(20) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size())\", _kjCondition, 20, root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size()"
                 ,(char (*) [110])
                  "failed: expected (20) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_700,(int *)(local_7b4 + 1),local_7b4);
      local_7a9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_6.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_8a0,(Builder *)&_kjCondition_6.result);
  toAny<capnproto_test::capnp::test::TestAllTypes::Builder>
            ((BuilderFor<AnyTypeFor<FromBuilder<Builder>_>_> *)auStack_878,&local_8a0);
  local_8e8 = 0x30;
  local_8e4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8e8);
  _auStack_900 = AnyStruct::Builder::getDataSection((Builder *)auStack_878);
  local_8f0 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)auStack_900);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_8e0,&local_8e4,&local_8f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8e0);
  if (!bVar1) {
    local_901 = kj::_::Debug::shouldLog(ERROR);
    while (local_901 != false) {
      local_908 = 0x30;
      AVar4 = AnyStruct::Builder::getDataSection((Builder *)auStack_878);
      _kjCondition_7._24_8_ = AVar4.ptr;
      local_910 = kj::ArrayPtr<unsigned_char>::size
                            ((ArrayPtr<unsigned_char> *)&_kjCondition_7.result);
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x82,ERROR,
                 "\"failed: expected \" \"(48) == (b.getDataSection().size())\", _kjCondition, 48, b.getDataSection().size()"
                 ,(char (*) [53])"failed: expected (48) == (b.getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_8e0,&local_908,&local_910);
      local_901 = false;
    }
  }
  local_94c[1] = 0x14;
  local_944 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_94c + 1));
  AnyStruct::Builder::getPointerSection((Builder *)local_978,(Builder *)auStack_878);
  local_94c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size((Builder *)local_978);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_940,&local_944,local_94c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_940);
  if (!bVar1) {
    local_979 = kj::_::Debug::shouldLog(ERROR);
    while (local_979 != false) {
      local_984[1] = 0x14;
      AnyStruct::Builder::getPointerSection(&local_9b0,(Builder *)auStack_878);
      local_984[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_9b0);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x83,ERROR,
                 "\"failed: expected \" \"(20) == (b.getPointerSection().size())\", _kjCondition, 20, b.getPointerSection().size()"
                 ,(char (*) [56])"failed: expected (20) == (b.getPointerSection().size())",
                 (DebugComparison<int,_unsigned_int> *)local_940,(int *)(local_984 + 1),local_984);
      local_979 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_8.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_a00,(Builder *)&_kjCondition_8.result);
  AnyStruct::Builder::Builder<capnproto_test::capnp::test::TestAllTypes::Builder,void>
            (&local_9d8,&local_a00);
  b._builder._24_8_ = local_9d8._builder._32_8_;
  b._builder.capTable = (CapTableBuilder *)local_9d8._builder.data;
  b._builder.ptr = (byte *)local_9d8._builder.pointers;
  auStack_878 = (undefined1  [8])local_9d8._builder.segment;
  b._builder.segment = (SegmentBuilder *)local_9d8._builder.capTable;
  local_a48 = 0x30;
  local_a44 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a48);
  _auStack_a60 = AnyStruct::Builder::getDataSection((Builder *)auStack_878);
  local_a50 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)auStack_a60);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_a40,&local_a44,&local_a50);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a40);
  if (!bVar1) {
    local_a61 = kj::_::Debug::shouldLog(ERROR);
    while (local_a61 != false) {
      local_a68 = 0x30;
      AVar4 = AnyStruct::Builder::getDataSection((Builder *)auStack_878);
      _kjCondition_9._24_8_ = AVar4.ptr;
      local_a70 = kj::ArrayPtr<unsigned_char>::size
                            ((ArrayPtr<unsigned_char> *)&_kjCondition_9.result);
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x87,ERROR,
                 "\"failed: expected \" \"(48) == (b.getDataSection().size())\", _kjCondition, 48, b.getDataSection().size()"
                 ,(char (*) [53])"failed: expected (48) == (b.getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_a40,&local_a68,&local_a70);
      local_a61 = false;
    }
  }
  local_aac[1] = 0x14;
  local_aa4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_aac + 1));
  AnyStruct::Builder::getPointerSection((Builder *)local_ad8,(Builder *)auStack_878);
  local_aac[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size((Builder *)local_ad8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_aa0,&local_aa4,local_aac);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_aa0);
  if (!bVar1) {
    local_ad9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ad9 != false) {
      local_ae4[1] = 0x14;
      AnyStruct::Builder::getPointerSection(&local_b10,(Builder *)auStack_878);
      local_ae4[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_b10);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x88,ERROR,
                 "\"failed: expected \" \"(20) == (b.getPointerSection().size())\", _kjCondition, 20, b.getPointerSection().size()"
                 ,(char (*) [56])"failed: expected (20) == (b.getPointerSection().size())",
                 (DebugComparison<int,_unsigned_int> *)local_aa0,(int *)(local_ae4 + 1),local_ae4);
      local_ad9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_10.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_ba0,(Builder *)&_kjCondition_10.result);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_b78,&local_ba0);
  toAny<capnproto_test::capnp::test::TestAllTypes::Reader>
            ((ReaderFor<AnyTypeFor<FromReader<Reader>_>_> *)auStack_b48,&local_b78);
  local_be8 = 0x30;
  local_be4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_be8);
  _auStack_c00 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
  local_bf0 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_c00);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_be0,&local_be4,&local_bf0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_be0);
  if (!bVar1) {
    local_c01 = kj::_::Debug::shouldLog(ERROR);
    while (local_c01 != false) {
      local_c08 = 0x30;
      AVar5 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
      _kjCondition_11._24_8_ = AVar5.ptr;
      local_c10 = kj::ArrayPtr<const_unsigned_char>::size
                            ((ArrayPtr<const_unsigned_char> *)&_kjCondition_11.result);
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x8c,ERROR,
                 "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
                 ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_be0,&local_c08,&local_c10);
      local_c01 = false;
    }
  }
  local_c4c[1] = 0x14;
  local_c44 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_c4c + 1));
  AnyStruct::Reader::getPointerSection((Reader *)local_c80,(Reader *)auStack_b48);
  local_c4c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)local_c80);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_c40,&local_c44,local_c4c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c40);
  if (!bVar1) {
    local_c81 = kj::_::Debug::shouldLog(ERROR);
    while (local_c81 != false) {
      local_c8c[1] = 0x14;
      AnyStruct::Reader::getPointerSection(&local_cc0,(Reader *)auStack_b48);
      local_c8c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_cc0);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x8d,ERROR,
                 "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
                 ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
                 (DebugComparison<int,_unsigned_int> *)local_c40,(int *)(local_c8c + 1),local_c8c);
      local_c81 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_12.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_d40,(Builder *)&_kjCondition_12.result);
  toAny<capnproto_test::capnp::test::TestAllTypes::Builder>(&local_d18,&local_d40);
  AnyStruct::Builder::asReader(&local_cf0,(Builder *)&local_d18);
  r._reader._24_8_ = local_cf0._reader._32_8_;
  r._reader.structDataSize = local_cf0._reader.nestingLimit;
  r._reader.structPointerCount = local_cf0._reader._44_2_;
  r._reader.elementSize = local_cf0._reader._46_1_;
  r._reader._39_1_ = local_cf0._reader._47_1_;
  r._reader.capTable = (CapTableReader *)local_cf0._reader.data;
  r._reader.ptr = (byte *)local_cf0._reader.pointers;
  auStack_b48 = (undefined1  [8])local_cf0._reader.segment;
  r._reader.segment = (SegmentReader *)local_cf0._reader.capTable;
  local_d88 = 0x30;
  local_d84 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d88);
  _auStack_da0 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
  local_d90 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_da0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_d80,&local_d84,&local_d90);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d80);
  if (!bVar1) {
    local_da1 = kj::_::Debug::shouldLog(ERROR);
    while (local_da1 != false) {
      local_da8 = 0x30;
      AVar5 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
      _kjCondition_13._24_8_ = AVar5.ptr;
      local_db0 = kj::ArrayPtr<const_unsigned_char>::size
                            ((ArrayPtr<const_unsigned_char> *)&_kjCondition_13.result);
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
                 ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_d80,&local_da8,&local_db0);
      local_da1 = false;
    }
  }
  local_dec[1] = 0x14;
  local_de4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_dec + 1));
  AnyStruct::Reader::getPointerSection((Reader *)local_e20,(Reader *)auStack_b48);
  local_dec[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)local_e20);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_de0,&local_de4,local_dec);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_de0);
  if (!bVar1) {
    local_e21 = kj::_::Debug::shouldLog(ERROR);
    while (local_e21 != false) {
      local_e2c[1] = 0x14;
      AnyStruct::Reader::getPointerSection(&local_e60,(Reader *)auStack_b48);
      local_e2c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_e60);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
                 ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
                 (DebugComparison<int,_unsigned_int> *)local_de0,(int *)(local_e2c + 1),local_e2c);
      local_e21 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_14.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_ee8,(Builder *)&_kjCondition_14.result);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_ec0,&local_ee8);
  AnyStruct::Reader::Reader<capnproto_test::capnp::test::TestAllTypes::Reader,void>
            (&local_e90,&local_ec0);
  r._reader._24_8_ = local_e90._reader._32_8_;
  r._reader.structDataSize = local_e90._reader.nestingLimit;
  r._reader.structPointerCount = local_e90._reader._44_2_;
  r._reader.elementSize = local_e90._reader._46_1_;
  r._reader._39_1_ = local_e90._reader._47_1_;
  r._reader.capTable = (CapTableReader *)local_e90._reader.data;
  r._reader.ptr = (byte *)local_e90._reader.pointers;
  auStack_b48 = (undefined1  [8])local_e90._reader.segment;
  r._reader.segment = (SegmentReader *)local_e90._reader.capTable;
  local_f30 = 0x30;
  local_f2c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f30);
  _auStack_f48 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
  local_f38 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_f48);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_f28,&local_f2c,&local_f38);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f28);
  if (!bVar1) {
    local_f49 = kj::_::Debug::shouldLog(ERROR);
    while (local_f49 != false) {
      local_f50 = 0x30;
      AVar5 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
      _kjCondition_15._24_8_ = AVar5.ptr;
      local_f58 = kj::ArrayPtr<const_unsigned_char>::size
                            ((ArrayPtr<const_unsigned_char> *)&_kjCondition_15.result);
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x95,ERROR,
                 "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
                 ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_f28,&local_f50,&local_f58);
      local_f49 = false;
    }
  }
  local_f94[1] = 0x14;
  local_f8c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_f94 + 1));
  AnyStruct::Reader::getPointerSection((Reader *)local_fc8,(Reader *)auStack_b48);
  local_f94[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)local_fc8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_f88,&local_f8c,local_f94);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f88);
  if (!bVar1) {
    local_fc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_fc9 != false) {
      local_fd4[1] = 0x14;
      AnyStruct::Reader::getPointerSection
                ((Reader *)&b2.moreSegments.builder.disposer,(Reader *)auStack_b48);
      local_fd4[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size
                               ((Reader *)&b2.moreSegments.builder.disposer);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x96,ERROR,
                 "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
                 ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
                 (DebugComparison<int,_unsigned_int> *)local_f88,(int *)(local_fd4 + 1),local_fd4);
      local_fc9 = false;
    }
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root2._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)&sb._builder.dataSize,(MessageBuilder *)&root2._builder.dataSize);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1160,(Builder *)&sb._builder.dataSize);
  local_1170 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
  sVar3 = kj::ArrayPtr<const_unsigned_char>::size(&local_1170);
  AnyStruct::Reader::getPointerSection((Reader *)&_kjCondition_16.result,(Reader *)auStack_b48);
  uVar2 = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)&_kjCondition_16.result);
  AnyPointer::Builder::initAsAnyStruct
            ((Builder *)local_1148,&local_1160,(uint16_t)(sVar3 >> 3),(uint16_t)uVar2);
  local_11d0 = 0x30;
  local_11cc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_11d0);
  _auStack_11e8 = AnyStruct::Builder::getDataSection((Builder *)local_1148);
  local_11d8 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)auStack_11e8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_11c8,&local_11cc,&local_11d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_11c8);
  if (!bVar1) {
    local_11e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_11e9 != false) {
      local_11f0 = 0x30;
      AVar4 = AnyStruct::Builder::getDataSection((Builder *)local_1148);
      _kjCondition_17._24_8_ = AVar4.ptr;
      local_11f8 = kj::ArrayPtr<unsigned_char>::size
                             ((ArrayPtr<unsigned_char> *)&_kjCondition_17.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x9f,ERROR,
                 "\"failed: expected \" \"(48) == (sb.getDataSection().size())\", _kjCondition, 48, sb.getDataSection().size()"
                 ,(char (*) [54])"failed: expected (48) == (sb.getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_11c8,&local_11f0,&local_11f8);
      local_11e9 = false;
    }
  }
  local_1234[1] = 0x14;
  local_122c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_1234 + 1));
  AnyStruct::Builder::getPointerSection((Builder *)local_1260,(Builder *)local_1148);
  local_1234[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size((Builder *)local_1260);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_1228,&local_122c,local_1234);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1228);
  if (!bVar1) {
    local_1261 = kj::_::Debug::shouldLog(ERROR);
    while (local_1261 != false) {
      local_126c[1] = 0x14;
      AnyStruct::Builder::getPointerSection(&local_1298,(Builder *)local_1148);
      local_126c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_1298);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xa0,ERROR,
                 "\"failed: expected \" \"(20) == (sb.getPointerSection().size())\", _kjCondition, 20, sb.getPointerSection().size()"
                 ,(char (*) [57])"failed: expected (20) == (sb.getPointerSection().size())",
                 (DebugComparison<int,_unsigned_int> *)local_1228,(int *)(local_126c + 1),local_126c
                );
      local_1261 = false;
    }
  }
  local_12a8 = AnyStruct::Builder::getDataSection((Builder *)local_1148);
  __dest = kj::ArrayPtr<unsigned_char>::begin(&local_12a8);
  local_12b8 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
  __src = kj::ArrayPtr<const_unsigned_char>::begin(&local_12b8);
  AVar5 = AnyStruct::Reader::getDataSection((Reader *)auStack_b48);
  ptrs.reader._40_8_ = AVar5.ptr;
  sVar3 = kj::ArrayPtr<const_unsigned_char>::size
                    ((ArrayPtr<const_unsigned_char> *)&ptrs.reader.nestingLimit);
  memcpy(__dest,__src,sVar3);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root2._builder.dataSize);
  AnyStruct::Reader::getPointerSection((Reader *)&_kjCondition_18.result,(Reader *)auStack_b48);
  local_1330 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
            ((Reader *)local_1360,(Reader *)&_kjCondition_18.result,0);
  local_1340 = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>((Reader *)local_1360);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1328,
             (DebugExpression<char_const(&)[4]> *)&local_1330,(Reader *)&local_1340);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1328);
  if (!bVar1) {
    local_1361 = kj::_::Debug::shouldLog(ERROR);
    while (local_1361 != false) {
      List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                ((Reader *)&_kjCondition_19.result,(Reader *)&_kjCondition_18.result,0);
      AVar6 = (ArrayPtr<const_char>)
              AnyPointer::Reader::getAs<capnp::Text>((Reader *)&_kjCondition_19.result);
      local_1378 = AVar6;
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xa8,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (ptrs[0].getAs<Text>())\", _kjCondition, \"foo\", ptrs[0].getAs<Text>()"
                 ,(char (*) [52])"failed: expected (\"foo\") == (ptrs[0].getAs<Text>())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1328,
                 (char (*) [4])"foo",(Reader *)&local_1378);
      local_1361 = false;
    }
  }
  local_13d8 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x439e6e);
  List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
            ((Reader *)local_1430,(Reader *)&_kjCondition_18.result,1);
  local_1410 = (ArrayPtr<const_unsigned_char>)
               AnyPointer::Reader::getAs<capnp::Data>((Reader *)local_1430);
  local_1400 = kj::ArrayPtr<const_unsigned_char>::asChars(&local_1410);
  AVar6.ptr = (char *)local_1400.size_;
  AVar6.size_ = (size_t)local_1400.ptr;
  kj::heapString(&local_13f0,(kj *)local_1400.ptr,AVar6);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_13d0,
             (DebugExpression<char_const(&)[4]> *)&local_13d8,&local_13f0);
  kj::String::~String(&local_13f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_13d0);
  if (!bVar1) {
    local_1431 = kj::_::Debug::shouldLog(ERROR);
    while (local_1431 != false) {
      List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                ((Reader *)&_kjCondition_20.result,(Reader *)&_kjCondition_18.result,1);
      AVar5 = (ArrayPtr<const_unsigned_char>)
              AnyPointer::Reader::getAs<capnp::Data>((Reader *)&_kjCondition_20.result);
      local_1470 = AVar5;
      AVar6 = kj::ArrayPtr<const_unsigned_char>::asChars(&local_1470);
      value.ptr = (char *)AVar6.size_;
      value.size_ = (size_t)AVar6.ptr;
      local_1460 = AVar6;
      kj::heapString(&local_1450,(kj *)AVar6.ptr,value);
      kj::_::Debug::
      log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xa9,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))\", _kjCondition, \"bar\", kj::heapString(ptrs[1].getAs<Data>().asChars())"
                 ,(char (*) [78])
                  "failed: expected (\"bar\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))",
                 (DebugComparison<const_char_(&)[4],_kj::String> *)local_13d0,(char (*) [4])0x439e6e
                 ,&local_1450);
      kj::String::~String(&local_1450);
      local_1431 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[4],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_13d0);
  local_14c8 = (char (*) [6])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [6])"xyzzy");
  List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
            ((Reader *)local_1528,(Reader *)&_kjCondition_18.result,0xf);
  AnyPointer::Reader::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
            (&local_1508,(Reader *)local_1528);
  local_14d8 = (ArrayPtr<const_char>)
               List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](&local_1508,1);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_14c0,
             (DebugExpression<char_const(&)[6]> *)&local_14c8,(Reader *)&local_14d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14c0);
  if (!bVar1) {
    local_1529 = kj::_::Debug::shouldLog(ERROR);
    while (local_1529 != false) {
      List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                ((Reader *)&ptrs_1.builder.structDataSize,(Reader *)&_kjCondition_18.result,0xf);
      AnyPointer::Reader::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
                (&local_1570,(Reader *)&ptrs_1.builder.structDataSize);
      AVar6 = (ArrayPtr<const_char>)
              List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](&local_1570,1);
      local_1540 = AVar6;
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xaa,ERROR,
                 "\"failed: expected \" \"(\\\"xyzzy\\\") == (ptrs[15].getAs<List<Text>>()[1])\", _kjCondition, \"xyzzy\", ptrs[15].getAs<List<Text>>()[1]"
                 ,(char (*) [64])"failed: expected (\"xyzzy\") == (ptrs[15].getAs<List<Text>>()[1])"
                 ,(DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_14c0,
                 (char (*) [6])"xyzzy",(Reader *)&local_1540);
      local_1529 = false;
    }
  }
  AnyStruct::Builder::getPointerSection((Builder *)&_kjCondition_21.result,(Builder *)auStack_878);
  local_15f8 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::operator[]
            ((Builder *)local_1628,(Builder *)&_kjCondition_21.result,0);
  AnyPointer::Builder::getAs<capnp::Text>(&local_1610,(Builder *)local_1628);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_15f0,
             (DebugExpression<char_const(&)[4]> *)&local_15f8,&local_1610);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_15f0);
  if (!bVar1) {
    local_1629 = kj::_::Debug::shouldLog(ERROR);
    while (local_1629 != false) {
      List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::operator[]
                ((Builder *)&_kjCondition_22.result,(Builder *)&_kjCondition_21.result,0);
      AnyPointer::Builder::getAs<capnp::Text>(&local_1648,(Builder *)&_kjCondition_22.result);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xaf,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (ptrs[0].getAs<Text>())\", _kjCondition, \"foo\", ptrs[0].getAs<Text>()"
                 ,(char (*) [52])"failed: expected (\"foo\") == (ptrs[0].getAs<Text>())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_15f0,
                 (char (*) [4])"foo",&local_1648);
      local_1629 = false;
    }
  }
  local_16a0 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x439e6e);
  List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::operator[]
            ((Builder *)local_1700,(Builder *)&_kjCondition_21.result,1);
  local_16e8 = (ArrayPtr<unsigned_char>)
               AnyPointer::Builder::getAs<capnp::Data>((Builder *)local_1700);
  local_16d8 = kj::ArrayPtr<unsigned_char>::asChars(&local_16e8);
  local_16c8 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_16d8);
  value_00.ptr = (char *)local_16c8.size_;
  value_00.size_ = (size_t)local_16c8.ptr;
  kj::heapString(&local_16b8,(kj *)local_16c8.ptr,value_00);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_1698,
             (DebugExpression<char_const(&)[4]> *)&local_16a0,&local_16b8);
  kj::String::~String(&local_16b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1698);
  if (!bVar1) {
    local_1701 = kj::_::Debug::shouldLog(ERROR);
    while (local_1701 != false) {
      List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::operator[]
                ((Builder *)&_kjCondition_23.result,(Builder *)&_kjCondition_21.result,1);
      AVar4 = (ArrayPtr<unsigned_char>)
              AnyPointer::Builder::getAs<capnp::Data>((Builder *)&_kjCondition_23.result);
      local_1750 = AVar4;
      AVar7 = kj::ArrayPtr<unsigned_char>::asChars(&local_1750);
      local_1740 = AVar7;
      AVar6 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_1740);
      value_01.ptr = (char *)AVar6.size_;
      value_01.size_ = (size_t)AVar6.ptr;
      local_1730 = AVar6;
      kj::heapString(&local_1720,(kj *)AVar6.ptr,value_01);
      kj::_::Debug::
      log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xb0,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))\", _kjCondition, \"bar\", kj::heapString(ptrs[1].getAs<Data>().asChars())"
                 ,(char (*) [78])
                  "failed: expected (\"bar\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))",
                 (DebugComparison<const_char_(&)[4],_kj::String> *)local_1698,(char (*) [4])0x439e6e
                 ,&local_1720);
      kj::String::~String(&local_1720);
      local_1701 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[4],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_1698);
  local_17a8 = (char (*) [6])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [6])"xyzzy");
  List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::operator[]
            ((Builder *)local_1800,(Builder *)&_kjCondition_21.result,0xf);
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
            (&local_17e8,(Builder *)local_1800);
  List<capnp::Text,_(capnp::Kind)1>::Builder::operator[](&local_17c0,&local_17e8,1);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)local_17a0,
             (DebugExpression<char_const(&)[6]> *)&local_17a8,&local_17c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_17a0);
  if (!bVar1) {
    local_1801 = kj::_::Debug::shouldLog(ERROR);
    while (local_1801 != false) {
      List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::operator[]
                (&local_1860,(Builder *)&_kjCondition_21.result,0xf);
      AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_1848,&local_1860);
      List<capnp::Text,_(capnp::Kind)1>::Builder::operator[](&local_1820,&local_1848,1);
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Builder>&,char_const(&)[6],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xb1,ERROR,
                 "\"failed: expected \" \"(\\\"xyzzy\\\") == (ptrs[15].getAs<List<Text>>()[1])\", _kjCondition, \"xyzzy\", ptrs[15].getAs<List<Text>>()[1]"
                 ,(char (*) [64])"failed: expected (\"xyzzy\") == (ptrs[15].getAs<List<Text>>()[1])"
                 ,(DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)local_17a0,
                 (char (*) [6])"xyzzy",&local_1820);
      local_1801 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Any, AnyStruct) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  auto allTypes = root.getAnyPointerField().getAs<AnyStruct>().as<TestAllTypes>();
  auto allTypesReader = root.getAnyPointerField().getAs<AnyStruct>().asReader().as<TestAllTypes>();
  allTypes.setInt32Field(100);
  EXPECT_EQ(100, allTypes.getInt32Field());
  EXPECT_EQ(100, allTypesReader.getInt32Field());

  EXPECT_EQ(48, root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size());
  EXPECT_EQ(20, root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size());

  EXPECT_EQ(48, root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size());
  EXPECT_EQ(20, root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size());

  auto b = toAny(root.getAnyPointerField().getAs<TestAllTypes>());
  EXPECT_EQ(48, b.getDataSection().size());
  EXPECT_EQ(20, b.getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  b = root.getAnyPointerField().getAs<TestAllTypes>();
  EXPECT_EQ(48, b.getDataSection().size());
  EXPECT_EQ(20, b.getPointerSection().size());
#endif

  auto r = toAny(root.getAnyPointerField().getAs<TestAllTypes>().asReader());
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());

  r = toAny(root.getAnyPointerField().getAs<TestAllTypes>()).asReader();
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());

#if !_MSC_VER || defined(__clang__)  // TODO(msvc): ICE on the necessary constructor; see any.h.
  r = root.getAnyPointerField().getAs<TestAllTypes>().asReader();
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());
#endif

  {
    MallocMessageBuilder b2;
    auto root2 = b2.getRoot<test::TestAnyPointer>();
    auto sb = root2.getAnyPointerField().initAsAnyStruct(
        r.getDataSection().size() / 8, r.getPointerSection().size());

    EXPECT_EQ(48, sb.getDataSection().size());
    EXPECT_EQ(20, sb.getPointerSection().size());

    // TODO: is there a higher-level API for this?
    memcpy(sb.getDataSection().begin(), r.getDataSection().begin(), r.getDataSection().size());
  }

  {
    auto ptrs = r.getPointerSection();
    EXPECT_EQ("foo", ptrs[0].getAs<Text>());
    EXPECT_EQ("bar", kj::heapString(ptrs[1].getAs<Data>().asChars()));
    EXPECT_EQ("xyzzy", ptrs[15].getAs<List<Text>>()[1]);
  }

  {
    auto ptrs = b.getPointerSection();
    EXPECT_EQ("foo", ptrs[0].getAs<Text>());
    EXPECT_EQ("bar", kj::heapString(ptrs[1].getAs<Data>().asChars()));
    EXPECT_EQ("xyzzy", ptrs[15].getAs<List<Text>>()[1]);
  }
}